

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

bool EV_TeleportOther(int other_tid,int dest_tid,bool fog)

{
  bool bVar1;
  AActor **ppAVar2;
  AActor *thing;
  bool bVar3;
  
  if (dest_tid == 0 || other_tid == 0) {
    bVar3 = false;
  }
  else {
    thing = (AActor *)0x0;
    bVar3 = false;
    while( true ) {
      ppAVar2 = &thing->inext;
      if (thing == (AActor *)0x0) {
        ppAVar2 = (AActor **)((long)AActor::TIDHash + (ulong)((other_tid & 0x7fU) << 3));
      }
      for (thing = *ppAVar2; (thing != (AActor *)0x0 && (thing->tid != other_tid));
          thing = thing->inext) {
      }
      if (thing == (AActor *)0x0) break;
      bVar1 = EV_Teleport(dest_tid,0,(line_t_conflict *)0x0,0,thing,4 - (uint)fog);
      bVar3 = (bool)(bVar3 | bVar1);
    }
  }
  return bVar3;
}

Assistant:

bool EV_TeleportOther (int other_tid, int dest_tid, bool fog)
{
	bool didSomething = false;

	if (other_tid != 0 && dest_tid != 0)
	{
		AActor *victim;
		FActorIterator iterator (other_tid);

		while ( (victim = iterator.Next ()) )
		{
			didSomething |= EV_Teleport (dest_tid, 0, NULL, 0, victim,
				fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
		}
	}

	return didSomething;
}